

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O1

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  uchar *puVar1;
  uchar uVar2;
  bool bVar3;
  byte bVar4;
  _Bool _Var5;
  int iVar6;
  Curl_URL *u_00;
  Curl_handler *pCVar7;
  size_t sVar8;
  uchar *__s;
  long lVar9;
  size_t sVar10;
  char *pcVar11;
  Curl_URL *pCVar12;
  uchar uVar13;
  byte bVar14;
  CURLUcode CVar15;
  uchar *puVar16;
  byte bVar17;
  uchar *puVar18;
  bool bVar19;
  byte bVar20;
  char *oldurl;
  CURLU *local_58;
  long local_50;
  uchar *local_40;
  char *local_38;
  
  bVar20 = 0;
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  if (part == (char *)0x0) {
    switch(what) {
    case CURLUPART_URL:
      u = (CURLU *)0x0;
      break;
    case CURLUPART_SCHEME:
      break;
    case CURLUPART_USER:
      u = (CURLU *)&u->user;
      break;
    case CURLUPART_PASSWORD:
      u = (CURLU *)&u->password;
      break;
    case CURLUPART_OPTIONS:
      u = (CURLU *)&u->options;
      break;
    case CURLUPART_HOST:
      u = (CURLU *)&u->host;
      break;
    case CURLUPART_PORT:
      u = (CURLU *)&u->port;
      break;
    case CURLUPART_PATH:
      u = (CURLU *)&u->path;
      break;
    case CURLUPART_QUERY:
      u = (CURLU *)&u->query;
      break;
    case CURLUPART_FRAGMENT:
      u = (CURLU *)&u->fragment;
      break;
    default:
      goto LAB_0043f3b5;
    }
    if (u == (CURLU *)0x0) {
      return CURLUE_OK;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  if (CURLUPART_FRAGMENT < what) {
LAB_0043f3b5:
    return CURLUE_UNKNOWN_PART;
  }
  bVar4 = (byte)flags >> 7;
  switch(what) {
  case CURLUPART_URL:
    _Var5 = Curl_is_absolute_url(part,(char *)0x0,8);
    if ((_Var5) || (CVar15 = curl_url_get(u,CURLUPART_URL,&local_38,flags), CVar15 != CURLUE_OK)) {
      u_00 = (Curl_URL *)(*Curl_ccalloc)(0x58,1);
      if (u_00 == (Curl_URL *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      CVar15 = parseurl(part,u_00,flags);
      if (CVar15 == CURLUE_OK) {
        free_urlhandle(u);
        pCVar12 = u_00;
        for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
          u->scheme = pCVar12->scheme;
          pCVar12 = (Curl_URL *)((long)pCVar12 + (ulong)bVar20 * -0x10 + 8);
          u = (CURLU *)((long)u + (ulong)bVar20 * -0x10 + 8);
        }
      }
      else {
        free_urlhandle(u_00);
      }
    }
    else {
      pCVar12 = (Curl_URL *)Curl_concat_url(local_38,part);
      (*Curl_cfree)(local_38);
      if (pCVar12 == (Curl_URL *)0x0) {
        return CURLUE_OUT_OF_MEMORY;
      }
      u_00 = (Curl_URL *)(*Curl_ccalloc)(0x58,1);
      if (u_00 == (Curl_URL *)0x0) {
        CVar15 = CURLUE_OUT_OF_MEMORY;
        u_00 = pCVar12;
      }
      else {
        CVar15 = parseurl((char *)pCVar12,u_00,flags);
        (*Curl_cfree)(pCVar12);
        if (CVar15 == CURLUE_OK) {
          free_urlhandle(u);
          pCVar12 = u_00;
          for (lVar9 = 0xb; lVar9 != 0; lVar9 = lVar9 + -1) {
            u->scheme = pCVar12->scheme;
            pCVar12 = (Curl_URL *)((long)pCVar12 + (ulong)bVar20 * -0x10 + 8);
            u = (CURLU *)((long)u + (ulong)bVar20 * -0x10 + 8);
          }
        }
        else {
          free_urlhandle(u_00);
        }
      }
    }
    (*Curl_cfree)(u_00);
    return CVar15;
  case CURLUPART_SCHEME:
    if (((flags & 8) == 0) && (pCVar7 = Curl_builtin_scheme(part), pCVar7 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    bVar17 = 0;
    bVar20 = 0;
    bVar14 = 0;
    bVar4 = 0;
    local_50 = 0;
    local_58 = u;
    goto LAB_0043f021;
  case CURLUPART_USER:
    local_58 = (CURLU *)&u->user;
    break;
  case CURLUPART_PASSWORD:
    local_58 = (CURLU *)&u->password;
    break;
  case CURLUPART_OPTIONS:
    local_58 = (CURLU *)&u->options;
    break;
  case CURLUPART_HOST:
    local_58 = (CURLU *)&u->host;
    break;
  case CURLUPART_PORT:
    local_50 = strtol(part,(char **)0x0,10);
    if (local_50 - 0x10000U < 0xffffffffffff0001) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    local_58 = (CURLU *)&u->port;
    bVar17 = 0;
    bVar20 = 0;
    bVar14 = 0;
    bVar4 = 0;
    goto LAB_0043f021;
  case CURLUPART_PATH:
    local_58 = (CURLU *)&u->path;
    bVar20 = 1;
    goto LAB_0043f016;
  case CURLUPART_QUERY:
    bVar17 = (byte)(flags >> 8) & 1;
    local_58 = (CURLU *)&u->query;
    bVar20 = 0;
    bVar14 = bVar4;
    goto LAB_0043f018;
  case CURLUPART_FRAGMENT:
    local_58 = (CURLU *)&u->fragment;
  }
  bVar20 = 0;
LAB_0043f016:
  bVar17 = 0;
  bVar14 = 0;
LAB_0043f018:
  local_50 = 0;
LAB_0043f021:
  if (bVar4 == 0) {
    __s = (uchar *)(*Curl_cstrdup)(part);
    CVar15 = CURLUE_OUT_OF_MEMORY;
    puVar16 = __s;
    if (__s != (uchar *)0x0) {
      do {
        lVar9 = 1;
        if (*puVar16 == '%') {
          iVar6 = Curl_isxdigit((uint)puVar16[1]);
          if (((iVar6 != 0) && (iVar6 = Curl_isxdigit((uint)puVar16[2]), iVar6 != 0)) &&
             ((iVar6 = Curl_isupper((uint)puVar16[1]), iVar6 != 0 ||
              (iVar6 = Curl_isupper((uint)puVar16[2]), iVar6 != 0)))) {
            iVar6 = tolower((uint)puVar16[1]);
            puVar16[1] = (uchar)iVar6;
            iVar6 = tolower((uint)puVar16[2]);
            puVar16[2] = (uchar)iVar6;
            lVar9 = 3;
          }
        }
        else if (*puVar16 == '\0') goto LAB_0043f108;
        puVar16 = puVar16 + lVar9;
      } while( true );
    }
  }
  else {
    sVar8 = strlen(part);
    __s = (uchar *)(*Curl_cmalloc)(sVar8 * 3 + 1);
    if (__s == (uchar *)0x0) {
      bVar19 = false;
      __s = (uchar *)part;
    }
    else {
      local_40 = (uchar *)part;
      if (bVar14 == 0) {
LAB_0043f140:
        uVar2 = *local_40;
        puVar16 = __s;
        puVar18 = local_40;
        while (uVar2 != '\0') {
          _Var5 = Curl_isunreserved(uVar2);
          if (_Var5) {
LAB_0043f162:
            *puVar16 = *puVar18;
            lVar9 = 1;
          }
          else {
            uVar2 = *puVar18;
            if ((((bVar14 & uVar2 == '+') != 0) || ((bool)(uVar2 == '/' & bVar20))) ||
               ((uVar2 == '=' & bVar17) != 0)) goto LAB_0043f162;
            curl_msnprintf((char *)puVar16,4,"%%%02x");
            lVar9 = 3;
          }
          puVar16 = puVar16 + lVar9;
          puVar1 = puVar18 + 1;
          puVar18 = puVar18 + 1;
          uVar2 = *puVar1;
        }
        *puVar16 = '\0';
        bVar19 = true;
        part = (char *)__s;
        bVar3 = true;
        if (bVar14 == 0) goto LAB_0043f2b1;
      }
      else {
        lVar9 = 0;
        while( true ) {
          uVar2 = part[lVar9];
          uVar13 = '+';
          if ((uVar2 != ' ') && (uVar13 = uVar2, uVar2 == '\0')) break;
          __s[lVar9] = uVar13;
          lVar9 = lVar9 + 1;
        }
        __s[lVar9] = '\0';
        local_40 = (uchar *)(*Curl_cstrdup)((char *)__s);
        if (local_40 != (uchar *)0x0) goto LAB_0043f140;
        local_40 = __s;
        bVar3 = false;
      }
      bVar19 = bVar3;
      (*Curl_cfree)(local_40);
      __s = (uchar *)part;
    }
LAB_0043f2b1:
    if (bVar19) {
LAB_0043f2b6:
      CVar15 = CURLUE_OUT_OF_MEMORY;
      if (bVar17 != 0) {
        pcVar11 = u->query;
        if (pcVar11 == (char *)0x0) {
          sVar8 = 0;
        }
        else {
          sVar8 = strlen(pcVar11);
        }
        if (sVar8 == 0) {
          bVar19 = false;
        }
        else {
          bVar19 = pcVar11[sVar8 - 1] != '&';
        }
        CVar15 = CURLUE_OUT_OF_MEMORY;
        if (sVar8 != 0) {
          sVar10 = strlen((char *)__s);
          pcVar11 = (char *)(*Curl_cmalloc)(sVar10 + bVar19 + sVar8 + 1);
          if (pcVar11 == (char *)0x0) {
            (*Curl_cfree)(__s);
          }
          else {
            strcpy(pcVar11,u->query);
            if (bVar19 != false) {
              pcVar11[sVar8] = '&';
            }
            strcpy(pcVar11 + bVar19 + sVar8,(char *)__s);
            (*Curl_cfree)(__s);
            (*Curl_cfree)(local_58->scheme);
            local_58->scheme = pcVar11;
            CVar15 = CURLUE_OK;
          }
        }
        if (sVar8 != 0) goto LAB_0043f388;
      }
      (*Curl_cfree)(local_58->scheme);
      local_58->scheme = (char *)__s;
      bVar19 = true;
      goto LAB_0043f3a1;
    }
    CVar15 = CURLUE_OUT_OF_MEMORY;
  }
LAB_0043f388:
  bVar19 = false;
LAB_0043f3a1:
  if ((bVar19) && (CVar15 = CURLUE_OK, local_50 != 0)) {
    u->portnum = local_50;
  }
  return CVar15;
LAB_0043f108:
  if (__s != (uchar *)0x0) goto LAB_0043f2b6;
  goto LAB_0043f388;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  long port = 0;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool appendquery = FALSE;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_PORT:
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      free(*storep);
      *storep = NULL;
    }
    return CURLUE_OK;
  }

  switch(what) {
  case CURLUPART_SCHEME:
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) &&
       /* verify that it is a fine scheme */
       !Curl_builtin_scheme(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    break;
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    break;
  case CURLUPART_PORT:
    urlencode = FALSE; /* never */
    port = strtol(part, NULL, 10);  /* Port number must be decimal */
    if((port <= 0) || (port > 0xffff))
      return CURLUE_BAD_PORT_NUMBER;
    storep = &u->port;
    break;
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    storep = &u->query;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLUcode result;
    char *oldurl;
    char *redired_url;
    CURLU *handle2;

    if(Curl_is_absolute_url(part, NULL, MAX_SCHEME_LEN)) {
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }
    /* extract the full "old" URL to do the redirect on */
    result = curl_url_get(u, CURLUPART_URL, &oldurl, flags);
    if(result) {
      /* couldn't get the old URL, just use the new! */
      handle2 = curl_url();
      if(!handle2)
        return CURLUE_OUT_OF_MEMORY;
      result = parseurl(part, handle2, flags);
      if(!result)
        mv_urlhandle(handle2, u);
      else
        curl_url_cleanup(handle2);
      return result;
    }

    /* apply the relative part to create a new URL */
    redired_url = Curl_concat_url(oldurl, part);
    free(oldurl);
    if(!redired_url)
      return CURLUE_OUT_OF_MEMORY;

    /* now parse the new URL */
    handle2 = curl_url();
    if(!handle2) {
      free(redired_url);
      return CURLUE_OUT_OF_MEMORY;
    }
    result = parseurl(redired_url, handle2, flags);
    free(redired_url);
    if(!result)
      mv_urlhandle(handle2, u);
    else
      curl_url_cleanup(handle2);
    return result;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  if(storep) {
    const char *newp = part;
    size_t nalloc = strlen(part);

    if(urlencode) {
      const char *i;
      char *o;
      bool free_part = FALSE;
      char *enc = malloc(nalloc * 3 + 1); /* for worst case! */
      if(!enc)
        return CURLUE_OUT_OF_MEMORY;
      if(plusencode) {
        /* space to plus */
        i = part;
        for(o = enc; *i; ++o, ++i)
          *o = (*i == ' ') ? '+' : *i;
        *o = 0; /* zero terminate */
        part = strdup(enc);
        if(!part) {
          free(enc);
          return CURLUE_OUT_OF_MEMORY;
        }
        free_part = TRUE;
      }
      for(i = part, o = enc; *i; i++) {
        if(Curl_isunreserved(*i) ||
           ((*i == '/') && urlskipslash) ||
           ((*i == '=') && appendquery) ||
           ((*i == '+') && plusencode)) {
          *o = *i;
          o++;
        }
        else {
          snprintf(o, 4, "%%%02x", *i);
          o += 3;
        }
      }
      *o = 0; /* zero terminate */
      newp = enc;
      if(free_part)
        free((char *)part);
    }
    else {
      char *p;
      newp = strdup(part);
      if(!newp)
        return CURLUE_OUT_OF_MEMORY;
      p = (char *)newp;
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = (char)TOLOWER(p[1]);
          p[2] = (char)TOLOWER(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }

    if(appendquery) {
      /* Append the string onto the old query. Add a '&' separator if none is
         present at the end of the exsting query already */
      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        size_t newplen = strlen(newp);
        char *p = malloc(querylen + addamperand + newplen + 1);
        if(!p) {
          free((char *)newp);
          return CURLUE_OUT_OF_MEMORY;
        }
        strcpy(p, u->query); /* original query */
        if(addamperand)
          p[querylen] = '&'; /* ampersand */
        strcpy(&p[querylen + addamperand], newp); /* new suffix */
        free((char *)newp);
        free(*storep);
        *storep = p;
        return CURLUE_OK;
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  /* set after the string, to make it not assigned if the allocation above
     fails */
  if(port)
    u->portnum = port;
  return CURLUE_OK;
}